

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP4Reader::DoGetSync
          (BP4Reader *this,Variable<unsigned_long> *variable,uint64_t *data)

{
  int iVar1;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  ScopedTimer __var2841;
  string local_78;
  string local_58;
  string local_38;
  
  if (DoGetSync(adios2::core::Variable<unsigned_long>&,unsigned_long*)::__var841 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoGetSync(adios2::core::Variable<unsigned_long>&,unsigned_long*)::
                                 __var841);
    if (iVar1 != 0) {
      DoGetSync::__var841 = (void *)ps_timer_create_("BP4Reader::Get");
      __cxa_guard_release(&DoGetSync(adios2::core::Variable<unsigned_long>&,unsigned_long*)::
                           __var841);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2841,DoGetSync::__var841);
  std::__cxx11::string::string((string *)&local_38,"Engine",&local_81);
  std::__cxx11::string::string((string *)&local_58,"BP4Reader",&local_82);
  std::__cxx11::string::string((string *)&local_78,"GetSync",&local_83);
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_38,&local_58,&local_78,&(variable->super_VariableBase).m_Name,0,iVar1,5,
              this->m_Verbosity,INFO);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  GetSyncCommon<unsigned_long>(this,variable,data);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2841);
  return;
}

Assistant:

void BP4Reader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::Close");
    helper::Log("Engine", "BP4Reader", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    PerformGets();
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    m_DataFileManager.CloseFiles();
    m_MDFileManager.CloseFiles();
    m_MDIndexFileManager.CloseFiles();
}